

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

CBlockIndex * __thiscall node::BlockManager::InsertBlockIndex(BlockManager *this,uint256 *hash)

{
  long lVar1;
  bool bVar2;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = base_blob<256U>::IsNull(&hash->super_base_blob<256U>);
  if (bVar2) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pVar5 = std::
            unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
            ::try_emplace<>(&this->m_block_index,hash);
    _Var3 = pVar5.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
            _M_cur;
    pCVar4 = (CBlockIndex *)
             ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                      _M_cur + 0x28) =
           (long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
           + 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* BlockManager::InsertBlockIndex(const uint256& hash)
{
    AssertLockHeld(cs_main);

    if (hash.IsNull()) {
        return nullptr;
    }

    const auto [mi, inserted]{m_block_index.try_emplace(hash)};
    CBlockIndex* pindex = &(*mi).second;
    if (inserted) {
        pindex->phashBlock = &((*mi).first);
    }
    return pindex;
}